

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O1

string * AssignIterator(string *__return_storage_ptr__,string *FileName)

{
  pointer pcVar1;
  undefined8 in_R9;
  ifstream ResultReader;
  long local_220 [29];
  undefined8 auStack_138 [36];
  
  std::ifstream::ifstream(local_220,(string *)FileName,_S_in|_S_bin);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::istream::seekg((long)local_220,_S_beg);
  std::istream::tellg();
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  std::istream::seekg((long)local_220,_S_beg);
  pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
  std::__cxx11::string::_M_replace_dispatch<std::istreambuf_iterator<char,std::char_traits<char>>>
            ((string *)__return_storage_ptr__,pcVar1,
             pcVar1 + __return_storage_ptr__->_M_string_length,
             *(undefined8 *)((long)auStack_138 + *(long *)(local_220[0] + -0x18)),0xffffffff,in_R9,0
             ,0xffffffff);
  std::ifstream::close();
  std::ifstream::~ifstream(local_220);
  return __return_storage_ptr__;
}

Assistant:

std::string AssignIterator(std::string FileName)
{
    std::ifstream ResultReader(FileName, std::ios::in | std::ios::binary);
    std::string Results;
    ResultReader.seekg(0, std::ios::end);
    Results.reserve(ResultReader.tellg());
    ResultReader.seekg(0, std::ios::beg);
    Results.assign((std::istreambuf_iterator<char>(ResultReader)), std::istreambuf_iterator<char>());
    ResultReader.close();
    return(Results);
}